

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::AddGlobalLinkInformation(cmMakefile *this,cmTarget *target)

{
  pointer pcVar1;
  TargetType TVar2;
  int iVar3;
  cmValue cVar4;
  cmTargetLinkLibraryType llt;
  pointer pbVar5;
  string_view arg;
  string libraryName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  string local_c8;
  cmMakefile *local_a8;
  optional<cmListFileBacktrace> local_a0;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_a8 = this;
  TVar2 = cmTarget::GetType(target);
  if (2 < TVar2 - UTILITY) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"LINK_LIBRARIES","");
    cVar4 = GetProperty(local_a8,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (cVar4.Value != (string *)0x0) {
      arg._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar4.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_(&local_48,arg,false);
      if (local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar5 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          pcVar1 = (pbVar5->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar1,pcVar1 + pbVar5->_M_string_length);
          iVar3 = std::__cxx11::string::compare((char *)&local_c8);
          if (iVar3 == 0) {
            pbVar5 = pbVar5 + 1;
            llt = OPTIMIZED_LibraryType;
            std::__cxx11::string::_M_assign((string *)&local_c8);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_c8);
            llt = GENERAL_LibraryType;
            if (iVar3 == 0) {
              pbVar5 = pbVar5 + 1;
              llt = DEBUG_LibraryType;
              std::__cxx11::string::_M_assign((string *)&local_c8);
            }
          }
          cmTarget::AddLinkLibrary(target,local_a8,&local_c8,llt);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"INTERFACE_LINK_LIBRARIES","");
          cmTarget::GetDebugGeneratorExpressions(&local_68,target,&local_c8,llt);
          local_a0.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
          super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
          super__Optional_payload_base<cmListFileBacktrace>._M_engaged = false;
          cmTarget::AppendProperty(target,&local_88,&local_68,&local_a0,false);
          if (local_a0.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
              super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
              super__Optional_payload_base<cmListFileBacktrace>._M_engaged == true) {
            local_a0.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
            super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
            super__Optional_payload_base<cmListFileBacktrace>._M_engaged = false;
            if (local_a0.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
                super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
                super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
                super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_a0.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload
                         .super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
                         super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          pbVar5 = pbVar5 + 1;
        } while (pbVar5 != local_48.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddGlobalLinkInformation(cmTarget& target)
{
  // for these targets do not add anything
  switch (target.GetType()) {
    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
      return;
    default:;
  }

  if (cmValue linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs = cmExpandedList(*linkLibsProp);

    for (auto j = linkLibs.begin(); j != linkLibs.end(); ++j) {
      std::string libraryName = *j;
      cmTargetLinkLibraryType libType = GENERAL_LibraryType;
      if (libraryName == "optimized") {
        libType = OPTIMIZED_LibraryType;
        ++j;
        libraryName = *j;
      } else if (libraryName == "debug") {
        libType = DEBUG_LibraryType;
        ++j;
        libraryName = *j;
      }
      // This is equivalent to the target_link_libraries plain signature.
      target.AddLinkLibrary(*this, libraryName, libType);
      target.AppendProperty(
        "INTERFACE_LINK_LIBRARIES",
        target.GetDebugGeneratorExpressions(libraryName, libType));
    }
  }
}